

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O2

int __thiscall Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _Head_base<0UL,_Buffer::Members_*,_false> in_RAX;
  Members *this_00;
  pointer __p;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> local_28;
  
  if ((EVP_PKEY_CTX *)this != dst) {
    this_00 = (Members *)operator_new(0x38);
    Members::Members(this_00,*(size_t *)(*(long *)dst + 0x28),(uchar *)0x0,true);
    local_28._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
    super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
         (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)
         (_Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>)0x0;
    std::__uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>::reset
              ((__uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> *)this,
               this_00);
    std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::~unique_ptr
              ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)&local_28);
    in_RAX._M_head_impl =
         (this->m)._M_t.
         super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
         super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
         super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
    if ((in_RAX._M_head_impl)->size != 0) {
      in_RAX._M_head_impl =
           (Members *)
           memcpy((in_RAX._M_head_impl)->buf,*(void **)(*(long *)dst + 0x30),
                  (in_RAX._M_head_impl)->size);
    }
  }
  return (int)in_RAX._M_head_impl;
}

Assistant:

void
Buffer::copy(Buffer const& rhs)
{
    if (this != &rhs) {
        m = std::unique_ptr<Members>(new Members(rhs.m->size, nullptr, true));
        if (m->size) {
            memcpy(m->buf, rhs.m->buf, m->size);
        }
    }
}